

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O0

string * deqp::gls::ShaderExecUtil::generateFragmentShader
                   (string *__return_storage_ptr__,ShaderSpec *shaderSpec,bool useIntOutputs,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *outLocationMap,string *inputPrefix,string *outputPrefix)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  ulong uVar4;
  pointer pSVar5;
  pointer pSVar6;
  istream *piVar7;
  allocator<char> local_491;
  string local_490;
  string local_470 [8];
  string line;
  istringstream opSrc;
  DeclareVariable local_2d0;
  __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
  local_290;
  __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
  local_288;
  const_iterator output;
  __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
  local_240;
  __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
  local_238;
  const_iterator input_1;
  DeclareVariable local_210;
  __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
  local_1d0;
  __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
  local_1c8;
  const_iterator input;
  ostringstream local_1b0 [8];
  ostringstream src;
  string *outputPrefix_local;
  string *inputPrefix_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *outLocationMap_local;
  bool useIntOutputs_local;
  ShaderSpec *shaderSpec_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  pcVar2 = glu::getGLSLVersionDeclaration(shaderSpec->version);
  poVar3 = std::operator<<((ostream *)local_1b0,pcVar2);
  std::operator<<(poVar3,"\n");
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)local_1b0,(string *)&shaderSpec->globalDeclarations);
    std::operator<<(poVar3,"\n");
  }
  local_1c8._M_current =
       (Symbol *)
       std::
       vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
       ::begin(&shaderSpec->inputs);
  while( true ) {
    local_1d0._M_current =
         (Symbol *)
         std::
         vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
         ::end(&shaderSpec->inputs);
    bVar1 = __gnu_cxx::operator!=(&local_1c8,&local_1d0);
    if (!bVar1) break;
    poVar3 = std::operator<<((ostream *)local_1b0,"flat in ");
    pSVar5 = __gnu_cxx::
             __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
             ::operator->(&local_1c8);
    pSVar6 = __gnu_cxx::
             __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
             ::operator->(&local_1c8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&input_1,
                   inputPrefix,&pSVar6->name);
    glu::declare(&local_210,&pSVar5->varType,(string *)&input_1,0);
    poVar3 = glu::decl::operator<<(poVar3,&local_210);
    std::operator<<(poVar3,";\n");
    glu::decl::DeclareVariable::~DeclareVariable(&local_210);
    std::__cxx11::string::~string((string *)&input_1);
    __gnu_cxx::
    __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
    ::operator++(&local_1c8);
  }
  generateFragShaderOutputDecl
            ((ostream *)local_1b0,shaderSpec,useIntOutputs,outLocationMap,outputPrefix);
  std::operator<<((ostream *)local_1b0,"\nvoid main (void)\n{\n");
  local_238._M_current =
       (Symbol *)
       std::
       vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
       ::begin(&shaderSpec->inputs);
  while( true ) {
    local_240._M_current =
         (Symbol *)
         std::
         vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
         ::end(&shaderSpec->inputs);
    bVar1 = __gnu_cxx::operator!=(&local_238,&local_240);
    if (!bVar1) break;
    poVar3 = std::operator<<((ostream *)local_1b0,"\t");
    pSVar5 = __gnu_cxx::
             __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
             ::operator->(&local_238);
    pSVar6 = __gnu_cxx::
             __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
             ::operator->(&local_238);
    glu::declare((DeclareVariable *)&output,&pSVar5->varType,&pSVar6->name,0);
    poVar3 = glu::decl::operator<<(poVar3,(DeclareVariable *)&output);
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = std::operator<<(poVar3,(string *)inputPrefix);
    pSVar5 = __gnu_cxx::
             __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
             ::operator->(&local_238);
    poVar3 = std::operator<<(poVar3,(string *)pSVar5);
    std::operator<<(poVar3,";\n");
    glu::decl::DeclareVariable::~DeclareVariable((DeclareVariable *)&output);
    __gnu_cxx::
    __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
    ::operator++(&local_238);
  }
  local_288._M_current =
       (Symbol *)
       std::
       vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
       ::begin(&shaderSpec->outputs);
  while( true ) {
    local_290._M_current =
         (Symbol *)
         std::
         vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
         ::end(&shaderSpec->outputs);
    bVar1 = __gnu_cxx::operator!=(&local_288,&local_290);
    if (!bVar1) break;
    poVar3 = std::operator<<((ostream *)local_1b0,"\t");
    pSVar5 = __gnu_cxx::
             __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
             ::operator->(&local_288);
    pSVar6 = __gnu_cxx::
             __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
             ::operator->(&local_288);
    glu::declare(&local_2d0,&pSVar5->varType,&pSVar6->name,0);
    poVar3 = glu::decl::operator<<(poVar3,&local_2d0);
    std::operator<<(poVar3,";\n");
    glu::decl::DeclareVariable::~DeclareVariable(&local_2d0);
    __gnu_cxx::
    __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
    ::operator++(&local_288);
  }
  std::__cxx11::istringstream::istringstream
            ((istringstream *)(line.field_2._M_local_buf + 8),(string *)&shaderSpec->source,_S_in);
  std::__cxx11::string::string(local_470);
  while( true ) {
    piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)(line.field_2._M_local_buf + 8),local_470);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
    if (!bVar1) break;
    poVar3 = std::operator<<((ostream *)local_1b0,"\t");
    poVar3 = std::operator<<(poVar3,local_470);
    std::operator<<(poVar3,"\n");
  }
  std::__cxx11::string::~string(local_470);
  std::__cxx11::istringstream::~istringstream((istringstream *)(line.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"",&local_491);
  generateFragShaderOutAssign((ostream *)local_1b0,shaderSpec,useIntOutputs,&local_490,outputPrefix)
  ;
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator(&local_491);
  std::operator<<((ostream *)local_1b0,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

static std::string generateFragmentShader (const ShaderSpec& shaderSpec, bool useIntOutputs, const std::map<std::string, int>& outLocationMap, const std::string& inputPrefix, const std::string& outputPrefix)
{
	DE_ASSERT(glu::glslVersionUsesInOutQualifiers(shaderSpec.version));

	std::ostringstream	src;

	src << glu::getGLSLVersionDeclaration(shaderSpec.version) << "\n";

	if (!shaderSpec.globalDeclarations.empty())
		src << shaderSpec.globalDeclarations << "\n";

	for (vector<Symbol>::const_iterator input = shaderSpec.inputs.begin(); input != shaderSpec.inputs.end(); ++input)
		src << "flat in " << glu::declare(input->varType, inputPrefix + input->name) << ";\n";

	generateFragShaderOutputDecl(src, shaderSpec, useIntOutputs, outLocationMap, outputPrefix);

	src << "\nvoid main (void)\n{\n";

	// Declare & fetch local input variables
	for (vector<Symbol>::const_iterator input = shaderSpec.inputs.begin(); input != shaderSpec.inputs.end(); ++input)
		src << "\t" << glu::declare(input->varType, input->name) << " = " << inputPrefix << input->name << ";\n";

	// Declare output variables
	for (vector<Symbol>::const_iterator output = shaderSpec.outputs.begin(); output != shaderSpec.outputs.end(); ++output)
		src << "\t" << glu::declare(output->varType, output->name) << ";\n";

	// Operation - indented to correct level.
	{
		std::istringstream	opSrc	(shaderSpec.source);
		std::string			line;

		while (std::getline(opSrc, line))
			src << "\t" << line << "\n";
	}

	generateFragShaderOutAssign(src, shaderSpec, useIntOutputs, "", outputPrefix);

	src << "}\n";

	return src.str();
}